

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_AssertionTest_x_iutest_x_False_Test::Body(iu_AssertionTest_x_iutest_x_False_Test *this)

{
  return;
}

Assistant:

IUTEST(AssertionTest, False)
{
    IUTEST_ASSERT_FALSE(false);
    IUTEST_EXPECT_FALSE(false);
    IUTEST_INFORM_FALSE(false);
    IUTEST_EXPECT_FALSE(0);
    IUTEST_EXPECT_FALSE(100!=100);
#if !defined(IUTEST_NO_VARIADIC_MACROS)
    IUTEST_ASSERT_FALSE(add_t<0, 0>::value);
    IUTEST_EXPECT_FALSE(add_t<0, 0>::value);
    IUTEST_INFORM_FALSE(add_t<0, 0>::value);
    IUTEST_ASSUME_FALSE(add_t<0, 0>::value);
#endif
}